

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v10::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  char *pcVar1;
  bool bVar2;
  int value_00;
  type tVar3;
  char *pcVar4;
  uint local_50;
  uint max;
  long num_digits;
  char *p;
  uint local_28;
  uint prev;
  uint value;
  int error_value_local;
  char *end_local;
  char **begin_local;
  
  if (((*begin != end) && ('/' < **begin)) && (**begin < ':')) {
    local_28 = 0;
    pcVar4 = *begin;
    begin_local._4_4_ = local_28;
    do {
      local_28 = begin_local._4_4_;
      num_digits = (long)pcVar4;
      begin_local._4_4_ = local_28 * 10 + *(char *)num_digits + -0x30;
      pcVar4 = (char *)(num_digits + 1);
      bVar2 = false;
      if ((pcVar4 != end) && (bVar2 = false, '/' < *pcVar4)) {
        bVar2 = *pcVar4 < ':';
      }
    } while (bVar2);
    pcVar1 = *begin;
    *begin = pcVar4;
    if (9 < (long)pcVar4 - (long)pcVar1) {
      value_00 = std::numeric_limits<int>::max();
      tVar3 = to_unsigned<int>(value_00);
      local_50 = error_value;
      if (((long)pcVar4 - (long)pcVar1 == 10) &&
         ((ulong)local_28 * 10 + (ulong)((int)*(char *)num_digits - 0x30) <= (ulong)tVar3)) {
        local_50 = begin_local._4_4_;
      }
      begin_local._4_4_ = local_50;
    }
    return begin_local._4_4_;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
              ,0x85e,"");
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}